

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clique.cpp
# Opt level: O2

void __thiscall
Clique::translate(Clique *this,size_t *translation_table,size_t table_size,size_t new_capacity)

{
  ulong *puVar1;
  alignment_set_t *this_00;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  ulong uVar2;
  allocator<unsigned_long> local_29;
  
  this_01 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)operator_new(0x20);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (this_01,new_capacity,0,&local_29);
  this_00 = this->alignment_set;
  for (uVar2 = 0; table_size != uVar2; uVar2 = uVar2 + 1) {
    if ((((_Vector_impl_data *)
         &(this_00->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)->
         _M_start[translation_table[uVar2] >> 6] >> (translation_table[uVar2] & 0x3f) & 1) != 0) {
      puVar1 = (this_01->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + (uVar2 >> 6);
      *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
    }
  }
  if (this_00 != (alignment_set_t *)0x0) {
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  }
  operator_delete(this_00);
  this->alignment_set = this_01;
  return;
}

Assistant:

void Clique::translate(size_t* translation_table, size_t table_size, size_t new_capacity) {
	alignment_set_t* new_alignment_set = new alignment_set_t(new_capacity);
	for (size_t i=0; i<table_size; ++i) {
		if (alignment_set->test(translation_table[i])) {
			new_alignment_set->set(i,true);
		}
	}
	delete alignment_set;
	alignment_set = new_alignment_set;
}